

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall Population::evolve(Population *this)

{
  ulong uVar1;
  size_type sVar2;
  double dVar3;
  DNA local_c0;
  DNA local_88;
  DNA *local_50;
  DNA *dna2;
  DNA *local_38;
  DNA *dna1;
  undefined1 local_28 [4];
  int i;
  vector<DNA,_std::allocator<DNA>_> new_population;
  Population *this_local;
  
  new_population.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<DNA,_std::allocator<DNA>_>::vector((vector<DNA,_std::allocator<DNA>_> *)local_28);
  dna1._4_4_ = 0;
  while( true ) {
    uVar1 = (ulong)dna1._4_4_;
    sVar2 = std::vector<DNA,_std::allocator<DNA>_>::size(&this->population_);
    if (sVar2 <= uVar1) break;
    dVar3 = RandomProbability();
    local_38 = GetDNAWithProbability(this,dVar3);
    dVar3 = RandomProbability();
    local_50 = GetDNAWithProbability(this,dVar3);
    crossover(&local_c0,this,local_38,local_50);
    mutation(&local_88,this,&local_c0);
    std::vector<DNA,_std::allocator<DNA>_>::push_back
              ((vector<DNA,_std::allocator<DNA>_> *)local_28,&local_88);
    DNA::~DNA(&local_88);
    DNA::~DNA(&local_c0);
    dna1._4_4_ = dna1._4_4_ + 1;
  }
  std::vector<DNA,_std::allocator<DNA>_>::operator=
            (&this->population_,(vector<DNA,_std::allocator<DNA>_> *)local_28);
  calcFitness(this);
  std::vector<DNA,_std::allocator<DNA>_>::~vector((vector<DNA,_std::allocator<DNA>_> *)local_28);
  return;
}

Assistant:

void Population::evolve() {
    vector<DNA> new_population;

    for (int i = 0; i < population_.size(); ++i) {
        const DNA& dna1 = GetDNAWithProbability(RandomProbability());
        const DNA& dna2 = GetDNAWithProbability(RandomProbability());
        new_population.push_back(mutation(crossover(dna1, dna2)));
    }

    population_ = move(new_population);
    calcFitness();
}